

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::ChLinkLock(ChLinkLock *this,ChLinkLock *other)

{
  ChLinkForce *pCVar1;
  ChLinkLimit *pCVar2;
  
  ChLinkMarkers::ChLinkMarkers(&this->super_ChLinkMarkers,&other->super_ChLinkMarkers);
  (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLinkLock_011621f8;
  ChLinkMaskLF::ChLinkMaskLF(&this->mask);
  (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->C_dt).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->C_dtdt).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->Cq1).super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows = 0;
  (this->Cq2).super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows = 0;
  (this->Cqw1).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>.m_storage.m_rows = 0;
  (this->Cqw2).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>.m_storage.m_rows = 0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->Ct).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->Ct_temp).pos.m_data[2] = 0.0;
  (this->Ct_temp).pos.m_data[0] = 0.0;
  (this->Ct_temp).pos.m_data[1] = 0.0;
  (this->force_D)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_R)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_X)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Y)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Z)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Rx)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Ry)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Rz)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->limit_X)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Y)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Z)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Rx)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Ry)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Rz)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Rp)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_D)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->Ct_temp).rot.m_data[0] = 1.0;
  (this->Ct_temp).rot.m_data[3] = 0.0;
  (this->Ct_temp).rot.m_data[1] = 0.0;
  (this->Ct_temp).rot.m_data[2] = 0.0;
  ChLinkMaskLF::operator=(&this->mask,&other->mask);
  pCVar1 = ChLinkForce::Clone((other->force_D)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_D,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_R)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_R,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_X)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_X,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_Y)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_Y,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_Z)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_Z,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_Rx)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_Rx,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_Ry)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_Ry,pCVar1);
  pCVar1 = ChLinkForce::Clone((other->force_Rz)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>
                              .super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_> *)
             &this->force_Rz,pCVar1);
  this->d_restlength = other->d_restlength;
  this->type = other->type;
  pCVar2 = ChLinkLimit::Clone((other->limit_X)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_X,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_Y)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_Y,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_Z)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_Z,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_Rx)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_Rx,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_Ry)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_Ry,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_Rz)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_Rz,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_Rp)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_Rp,pCVar2);
  pCVar2 = ChLinkLimit::Clone((other->limit_D)._M_t.
                              super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
                              .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>::reset
            ((__uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_> *)
             &this->limit_D,pCVar2);
  ChCoordsys<double>::operator=(&this->Ct_temp,&other->Ct_temp);
  BuildLinkType(this,other->type);
  return;
}

Assistant:

ChLinkLock::ChLinkLock(const ChLinkLock& other) : ChLinkMarkers(other) {
    mask = other.mask;

    force_D.reset(other.force_D->Clone());
    force_R.reset(other.force_R->Clone());
    force_X.reset(other.force_X->Clone());
    force_Y.reset(other.force_Y->Clone());
    force_Z.reset(other.force_Z->Clone());
    force_Rx.reset(other.force_Rx->Clone());
    force_Ry.reset(other.force_Ry->Clone());
    force_Rz.reset(other.force_Rz->Clone());

    d_restlength = other.d_restlength;

    type = other.type;

    limit_X.reset(other.limit_X->Clone());
    limit_Y.reset(other.limit_Y->Clone());
    limit_Z.reset(other.limit_Z->Clone());
    limit_Rx.reset(other.limit_Rx->Clone());
    limit_Ry.reset(other.limit_Ry->Clone());
    limit_Rz.reset(other.limit_Rz->Clone());
    limit_Rp.reset(other.limit_Rp->Clone());
    limit_D.reset(other.limit_D->Clone());

    Ct_temp = other.Ct_temp;

    BuildLinkType(other.type);
}